

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::Image::Image
          (Image *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkImageCreateInfo *imageCreateInfo,MemoryRequirement memoryRequirement)

{
  undefined1 local_78 [16];
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  Move<vk::Handle<(vk::HandleType)9>_> local_50;
  
  ::vk::createImage(&local_50,vk,device,imageCreateInfo,(VkAllocationCallbacks *)0x0);
  local_68 = local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pVStack_60 = local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  local_78._0_8_ = local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_78._8_8_ =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78,vk,device,
            allocator,
            (VkImage)(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,memoryRequirement);
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)local_78._0_8_;
  return;
}

Assistant:

Image::Image (const vk::DeviceInterface&		vk,
			  const vk::VkDevice				device,
			  vk::Allocator&					allocator,
			  const vk::VkImageCreateInfo&		imageCreateInfo,
			  const vk::MemoryRequirement		memoryRequirement)
	: m_image		(createImage(vk, device, &imageCreateInfo))
	, m_allocation	(bindImage(vk, device, allocator, *m_image, memoryRequirement))
{
}